

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O0

int disable_gm_search_based_on_stats(AV1_COMP *cpi)

{
  bool bVar1;
  int is_gm_present;
  AV1_COMP *cpi_local;
  
  bVar1 = true;
  if (((-1 < (cpi->ppi->gf_group).arf_index) &&
      (bVar1 = true, cpi->ppi->valid_gm_model_found[3] == 0)) &&
     (bVar1 = true, cpi->ppi->valid_gm_model_found[6] == 0)) {
    bVar1 = cpi->ppi->valid_gm_model_found[1] != 0;
  }
  return (int)((bVar1 ^ 0xffU) & 1);
}

Assistant:

static int disable_gm_search_based_on_stats(const AV1_COMP *const cpi) {
  int is_gm_present = 1;

  // Check number of GM models only in GF groups with ARF frames. GM param
  // estimation is always done in the case of GF groups with no ARF frames (flat
  // gops)
  if (cpi->ppi->gf_group.arf_index > -1) {
    // valid_gm_model_found is initialized to INT32_MAX in the beginning of
    // every GF group.
    // Therefore, GM param estimation is always done for all frames until
    // at least 1 frame each of ARF_UPDATE, INTNL_ARF_UPDATE and LF_UPDATE are
    // encoded in a GF group For subsequent frames, GM param estimation is
    // disabled, if no valid models have been found in all the three update
    // types.
    is_gm_present = (cpi->ppi->valid_gm_model_found[ARF_UPDATE] != 0) ||
                    (cpi->ppi->valid_gm_model_found[INTNL_ARF_UPDATE] != 0) ||
                    (cpi->ppi->valid_gm_model_found[LF_UPDATE] != 0);
  }
  return !is_gm_present;
}